

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzrot.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzrot::NodeIntLoadResidual_F
          (ChNodeFEAxyzrot *this,uint off,ChVectorDynamic<> *R,double c)

{
  undefined1 *this_00;
  double *pdVar1;
  long *plVar2;
  ulong *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double *pdVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  long lVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  long in_XMM0_Qb;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ChVector<double> v;
  double local_68 [3];
  ulong uStack_50;
  double dStack_48;
  ulong uStack_40;
  double dStack_38;
  long lStack_30;
  
  this_00 = &(this->super_ChNodeFEAbase).field_0x18;
  dStack_38 = c;
  lStack_30 = in_XMM0_Qb;
  ChFrameMoving<double>::GetWvel_loc((ChFrameMoving<double> *)this_00);
  ChFrameMoving<double>::GetWvel_loc((ChFrameMoving<double> *)this_00);
  lVar24 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3
  ;
  if (lVar24 < (long)(ulong)off) goto LAB_0064db17;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = uStack_50;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = uStack_40;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = local_68[1];
  auVar23._8_8_ = lStack_30;
  auVar23._0_8_ = dStack_38;
  pdVar10 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar26 = 3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       dStack_48 *
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        8);
  auVar4 = vfmadd231sd_fma(auVar33,auVar36,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x18);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       dStack_48 *
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x20);
  auVar5 = vfmadd231sd_fma(auVar34,auVar36,auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x30);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       dStack_48 *
       *(double *)
        ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        0x38);
  auVar6 = vfmadd231sd_fma(auVar35,auVar36,auVar6);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = local_68[0];
  pdVar1 = pdVar10 + off;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x10);
  auVar4 = vfmadd231sd_fma(auVar4,auVar38,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x40);
  auVar6 = vfmadd231sd_fma(auVar6,auVar38,auVar8);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(double *)
                  ((long)(this->variables).inertia.super_Matrix<double,_3,_3,_1,_3,_3>.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                         m_data.array + 0x28);
  auVar5 = vfmadd231sd_fma(auVar5,auVar38,auVar9);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = local_68[2];
  if (((ulong)pdVar1 & 7) == 0) {
    uVar27 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar27 < 3) {
      uVar26 = (ulong)uVar27;
    }
    if (uVar27 != 0) goto LAB_0064d9d3;
  }
  else {
LAB_0064d9d3:
    uVar28 = 0;
    do {
      pdVar1[uVar28] = dStack_38 * (this->Force).m_data[uVar28] + pdVar1[uVar28];
      uVar28 = uVar28 + 1;
    } while (uVar26 != uVar28);
  }
  auVar43._8_8_ = 0;
  auVar43._0_8_ = auVar5._0_8_ * local_68[2];
  auVar7 = vfmsub213sd_fma(auVar6,auVar40,auVar43);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar6._0_8_ * local_68[0];
  auVar6 = vfmsub213sd_fma(auVar4,auVar39,auVar42);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = auVar4._0_8_ * local_68[1];
  auVar4 = vfmsub213sd_fma(auVar5,auVar37,auVar41);
  if (uVar26 < 3) {
    do {
      pdVar1[uVar26] = dStack_38 * (this->Force).m_data[uVar26] + pdVar1[uVar26];
      uVar26 = uVar26 + 1;
    } while (uVar26 != 3);
  }
  local_68[0] = (this->Torque).m_data[0] - auVar7._0_8_;
  local_68[1] = (this->Torque).m_data[1] - auVar6._0_8_;
  local_68[2] = (this->Torque).m_data[2] - auVar4._0_8_;
  if (lVar24 < (long)(ulong)(off + 3)) {
LAB_0064db17:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar10 = pdVar10 + (off + 3);
  uVar27 = 3;
  if (((ulong)pdVar10 & 7) == 0) {
    uVar25 = -((uint)((ulong)pdVar10 >> 3) & 0x1fffffff) & 7;
    if (uVar25 < 3) {
      uVar27 = uVar25;
    }
    if (uVar25 == 0) goto LAB_0064dac4;
  }
  auVar30 = vbroadcastsd_avx512f(auVar23);
  auVar31 = vpbroadcastq_avx512f();
  uVar26 = vpcmpuq_avx512f(auVar31,_DAT_00971e40,5);
  bVar11 = (byte)uVar26;
  auVar31._8_8_ = (ulong)((byte)(uVar26 >> 1) & 1) * (long)local_68[1];
  auVar31._0_8_ = (ulong)(bVar11 & 1) * (long)local_68[0];
  auVar31._16_8_ = (ulong)((byte)(uVar26 >> 2) & 1) * (long)local_68[2];
  auVar31._24_8_ = ((byte)(uVar26 >> 3) & 1) * uStack_50;
  auVar31._32_8_ = (ulong)((byte)(uVar26 >> 4) & 1) * (long)dStack_48;
  auVar31._40_8_ = ((byte)(uVar26 >> 5) & 1) * uStack_40;
  auVar31._48_8_ = (ulong)((byte)(uVar26 >> 6) & 1) * (long)dStack_38;
  auVar31._56_8_ = (uVar26 >> 7) * lStack_30;
  auVar32._8_8_ = (ulong)((byte)(uVar26 >> 1) & 1) * (long)pdVar10[1];
  auVar32._0_8_ = (ulong)(bVar11 & 1) * (long)*pdVar10;
  auVar32._16_8_ = (ulong)((byte)(uVar26 >> 2) & 1) * (long)pdVar10[2];
  auVar32._24_8_ = (ulong)((byte)(uVar26 >> 3) & 1) * (long)pdVar10[3];
  auVar32._32_8_ = (ulong)((byte)(uVar26 >> 4) & 1) * (long)pdVar10[4];
  auVar32._40_8_ = (ulong)((byte)(uVar26 >> 5) & 1) * (long)pdVar10[5];
  auVar32._48_8_ = (ulong)((byte)(uVar26 >> 6) & 1) * (long)pdVar10[6];
  auVar32._56_8_ = (uVar26 >> 7) * (long)pdVar10[7];
  auVar30 = vmulpd_avx512f(auVar31,auVar30);
  auVar30 = vaddpd_avx512f(auVar30,auVar32);
  bVar12 = (bool)((byte)(uVar26 >> 1) & 1);
  bVar13 = (bool)((byte)(uVar26 >> 2) & 1);
  bVar14 = (bool)((byte)(uVar26 >> 3) & 1);
  bVar15 = (bool)((byte)(uVar26 >> 4) & 1);
  bVar16 = (bool)((byte)(uVar26 >> 5) & 1);
  bVar17 = (bool)((byte)(uVar26 >> 6) & 1);
  *pdVar10 = (double)((ulong)(bVar11 & 1) * auVar30._0_8_ |
                     (ulong)!(bool)(bVar11 & 1) * (long)*pdVar10);
  pdVar10[1] = (double)((ulong)bVar12 * auVar30._8_8_ | (ulong)!bVar12 * (long)pdVar10[1]);
  pdVar10[2] = (double)((ulong)bVar13 * auVar30._16_8_ | (ulong)!bVar13 * (long)pdVar10[2]);
  pdVar10[3] = (double)((ulong)bVar14 * auVar30._24_8_ | (ulong)!bVar14 * (long)pdVar10[3]);
  pdVar10[4] = (double)((ulong)bVar15 * auVar30._32_8_ | (ulong)!bVar15 * (long)pdVar10[4]);
  pdVar10[5] = (double)((ulong)bVar16 * auVar30._40_8_ | (ulong)!bVar16 * (long)pdVar10[5]);
  pdVar10[6] = (double)((ulong)bVar17 * auVar30._48_8_ | (ulong)!bVar17 * (long)pdVar10[6]);
  pdVar10[7] = (double)((uVar26 >> 7) * auVar30._56_8_ |
                       (ulong)!SUB81(uVar26 >> 7,0) * (long)pdVar10[7]);
LAB_0064dac4:
  if (uVar27 < 3) {
    uVar28 = (ulong)(uVar27 << 3);
    auVar29 = vpbroadcastq_avx512vl();
    uVar26 = vpcmpuq_avx512vl(auVar29,_DAT_00955380,5);
    uVar26 = uVar26 & 0xf;
    lVar24 = *(long *)((long)local_68 + uVar28 + 8);
    lVar18 = *(long *)((long)local_68 + uVar28 + 0x10);
    lVar19 = *(long *)((long)&uStack_50 + uVar28);
    bVar11 = (byte)uVar26;
    plVar2 = (long *)((long)pdVar10 + uVar28);
    lVar20 = plVar2[1];
    lVar21 = plVar2[2];
    lVar22 = plVar2[3];
    puVar3 = (ulong *)((long)pdVar10 + uVar28);
    bVar12 = (bool)((byte)(uVar26 >> 1) & 1);
    bVar13 = (bool)((byte)(uVar26 >> 2) & 1);
    *puVar3 = (ulong)(bVar11 & 1) *
              (long)((double)((ulong)(bVar11 & 1) * *(long *)((long)local_68 + uVar28)) * dStack_38
                    + (double)((ulong)(bVar11 & 1) * *plVar2)) |
              (ulong)!(bool)(bVar11 & 1) * *puVar3;
    puVar3[1] = (ulong)bVar12 *
                (long)((double)((ulong)((byte)(uVar26 >> 1) & 1) * lVar24) * dStack_38 +
                      (double)((ulong)((byte)(uVar26 >> 1) & 1) * lVar20)) |
                (ulong)!bVar12 * puVar3[1];
    puVar3[2] = (ulong)bVar13 *
                (long)((double)((ulong)((byte)(uVar26 >> 2) & 1) * lVar18) * dStack_38 +
                      (double)((ulong)((byte)(uVar26 >> 2) & 1) * lVar21)) |
                (ulong)!bVar13 * puVar3[2];
    puVar3[3] = (uVar26 >> 3) *
                (long)((double)((uVar26 >> 3) * lVar19) * dStack_38 +
                      (double)((uVar26 >> 3) * lVar22)) | (ulong)!SUB81(uVar26 >> 3,0) * puVar3[3];
  }
  return;
}

Assistant:

void ChNodeFEAxyzrot::NodeIntLoadResidual_F(const unsigned int off, ChVectorDynamic<>& R, const double c) {
    ChVector<> gyro = Vcross(this->GetWvel_loc(), (variables.GetBodyInertia() * this->GetWvel_loc()));

    R.segment(off + 0, 3) += c * Force.eigen();
    R.segment(off + 3, 3) += c * (Torque - gyro).eigen();
}